

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::testDraw
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices)

{
  GLuint array_length_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  bool local_1ba;
  byte local_1b9;
  vec4<float> *local_1a8;
  vec4<float> *local_188;
  uint local_180;
  GLuint i_2;
  GLuint array_length;
  GLuint *uint_data;
  GLuint i_1;
  GLfloat *float_data;
  undefined1 local_158;
  bool results [7];
  vec4<float> vec4_results [7];
  GLvoid *feedback_data;
  GLuint location;
  GLuint i;
  vec4<float> expected_results [7];
  GLuint subroutine_indices [4];
  bool result;
  Functions *gl;
  vec4<unsigned_int> *indices_local;
  vec4<float> *right_local;
  vec4<float> *left_local;
  GLuint *combination_local;
  FunctionalTest7_8 *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  subroutine_indices[3]._3_1_ = 1;
  local_188 = (vec4<float> *)&location;
  do {
    Utils::vec4<float>::vec4(local_188);
    local_188 = local_188 + 1;
  } while (local_188 != (vec4<float> *)&expected_results[6].m_z);
  calculate(this,combination,left,right,indices,(vec4<float> *)&location,
            (vec4<float> *)&expected_results[0].m_z,(vec4<float> *)&expected_results[1].m_z,
            (vec4<float> *)&expected_results[2].m_z,(vec4<float> *)&expected_results[3].m_z,
            (vec4<float> *)&expected_results[4].m_z,(vec4<float> *)&expected_results[5].m_z);
  (**(code **)(lVar6 + 0x15a0))
            (left->m_x,left->m_y,left->m_z,left->m_w,this->m_uniform_locations[0]);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x12f3);
  (**(code **)(lVar6 + 0x15a0))
            (right->m_x,right->m_y,right->m_z,right->m_w,this->m_uniform_locations[1]);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x12f6);
  (**(code **)(lVar6 + 0x15c0))
            (this->m_uniform_locations[2],indices->m_x,indices->m_y,indices->m_z,indices->m_w);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Uniform4ui",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x12f9);
  for (feedback_data._4_4_ = 0; feedback_data._4_4_ < 4;
      feedback_data._4_4_ = feedback_data._4_4_ + 1) {
    subroutine_indices[(ulong)this->m_subroutine_uniform_locations[feedback_data._4_4_] - 2] =
         this->m_subroutine_indices[combination[feedback_data._4_4_]];
  }
  (**(code **)(lVar6 + 0x1668))(0x8b31,4,&expected_results[6].m_z);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1305);
  (**(code **)(lVar6 + 0x30))(0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1309);
  (**(code **)(lVar6 + 0x538))(0,0,1);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x130c);
  (**(code **)(lVar6 + 0x638))();
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x130f);
  vec4_results[6]._8_8_ = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1313);
  local_1a8 = (vec4<float> *)&local_158;
  do {
    Utils::vec4<float>::vec4(local_1a8);
    uVar1 = vec4_results[6]._8_8_;
    local_1a8 = local_1a8 + 1;
  } while (local_1a8 != (vec4<float> *)&vec4_results[6].m_z);
  for (uint_data._4_4_ = 0; uint_data._4_4_ < 7; uint_data._4_4_ = uint_data._4_4_ + 1) {
    vec4_results[(ulong)uint_data._4_4_ - 1].m_z =
         *(float *)(uVar1 + (ulong)(uint_data._4_4_ << 2) * 4);
    vec4_results[(ulong)uint_data._4_4_ - 1].m_w =
         *(float *)(uVar1 + (ulong)(uint_data._4_4_ * 4 + 1) * 4);
    vec4_results[uint_data._4_4_].m_x = *(float *)(uVar1 + (ulong)(uint_data._4_4_ * 4 + 2) * 4);
    vec4_results[uint_data._4_4_].m_y = *(float *)(uVar1 + (ulong)(uint_data._4_4_ * 4 + 3) * 4);
  }
  array_length_00 = *(GLuint *)(uVar1 + 0x70);
  (**(code **)(lVar6 + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1325);
  for (local_180 = 0; local_180 < 7; local_180 = local_180 + 1) {
    bVar2 = Utils::vec4<float>::operator==
                      ((vec4<float> *)&vec4_results[(ulong)local_180 - 1].m_z,
                       (vec4<float> *)(&location + (ulong)local_180 * 4));
    *(bool *)((long)&float_data + (ulong)local_180 + 1) = bVar2;
    local_1b9 = 0;
    if (subroutine_indices[3]._3_1_ != 0) {
      local_1b9 = *(byte *)((long)&float_data + (ulong)local_180 + 1);
    }
    subroutine_indices[3]._3_1_ = local_1b9 & 1;
  }
  local_1ba = subroutine_indices[3]._3_1_ != 0 && array_length_00 == 4;
  if (subroutine_indices[3]._3_1_ == 0 || array_length_00 != 4) {
    logError(this,combination,left,right,indices,(vec4<float> *)&location,(vec4<float> *)&local_158,
             array_length_00,(bool *)((long)&float_data + 1));
  }
  return local_1ba;
}

Assistant:

bool FunctionalTest7_8::testDraw(const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left,
								 const Utils::vec4<glw::GLfloat>& right, const Utils::vec4<glw::GLuint>& indices) const
{
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	static const GLuint   n_vec4_varyings = 7;
	bool				  result		  = true;
	GLuint				  subroutine_indices[4];
	static const GLuint   n_subroutine_uniforms = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	/* Prepare expected results */
	Utils::vec4<glw::GLfloat> expected_results[7];
	calculate(combination, left, right, indices, expected_results[0], expected_results[1], expected_results[2],
			  expected_results[3], expected_results[4], expected_results[5], expected_results[6]);

	/* Set up input data uniforms */
	gl.uniform4f(m_uniform_locations[0], left.m_x, left.m_y, left.m_z, left.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	gl.uniform4f(m_uniform_locations[1], right.m_x, right.m_y, right.m_z, right.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	gl.uniform4ui(m_uniform_locations[2], indices.m_x, indices.m_y, indices.m_z, indices.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4ui");

	/* Prepare subroutine uniform data */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];

		subroutine_indices[location] = m_subroutine_indices[combination[i]];
	}

	/* Set up subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_subroutine_uniforms, &subroutine_indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLvoid* feedback_data = (GLvoid*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLfloat> vec4_results[7];
	bool				 results[7];
	GLfloat*			 float_data = (GLfloat*)feedback_data;
	for (GLuint i = 0; i < n_vec4_varyings; ++i)
	{
		vec4_results[i].m_x = float_data[i * 4 + 0];
		vec4_results[i].m_y = float_data[i * 4 + 1];
		vec4_results[i].m_z = float_data[i * 4 + 2];
		vec4_results[i].m_w = float_data[i * 4 + 3];
	}

	GLuint* uint_data	= (GLuint*)(float_data + (n_vec4_varyings)*4);
	GLuint  array_length = uint_data[0];

	/* Unmap buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Verification */
	for (GLuint i = 0; i < n_vec4_varyings; ++i)
	{
		results[i] = (vec4_results[i] == expected_results[i]);
		result	 = result && results[i];
	}

	result = result && (4 == array_length);

	/* Log error if any */
	if (false == result)
	{
		logError(combination, left, right, indices, expected_results, vec4_results, array_length, results);
	}

	/* Done */
	return result;
}